

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

void xmlSchemaSetParserStructuredErrors
               (xmlSchemaParserCtxtPtr ctxt,xmlStructuredErrorFunc serror,void *ctx)

{
  void *ctx_local;
  xmlStructuredErrorFunc serror_local;
  xmlSchemaParserCtxtPtr ctxt_local;
  
  if (ctxt != (xmlSchemaParserCtxtPtr)0x0) {
    ctxt->serror = serror;
    ctxt->errCtxt = ctx;
    if (ctxt->vctxt != (xmlSchemaValidCtxtPtr)0x0) {
      xmlSchemaSetValidStructuredErrors(ctxt->vctxt,serror,ctx);
    }
  }
  return;
}

Assistant:

void
xmlSchemaSetParserStructuredErrors(xmlSchemaParserCtxtPtr ctxt,
				   xmlStructuredErrorFunc serror,
				   void *ctx)
{
    if (ctxt == NULL)
	return;
    ctxt->serror = serror;
    ctxt->errCtxt = ctx;
    if (ctxt->vctxt != NULL)
	xmlSchemaSetValidStructuredErrors(ctxt->vctxt, serror, ctx);
}